

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

void __thiscall
duckdb::Deserializer::ReadDeletedProperty<unsigned_long>
          (Deserializer *this,field_id_t field_id,char *tag)

{
  uint uVar1;
  _func_int **pp_Var2;
  undefined6 in_register_00000032;
  
  uVar1 = (*this->_vptr_Deserializer[4])(this,CONCAT62(in_register_00000032,field_id));
  pp_Var2 = this->_vptr_Deserializer;
  if ((char)uVar1 != '\0') {
    (*pp_Var2[0x15])(this);
    pp_Var2 = this->_vptr_Deserializer;
  }
  (*pp_Var2[5])(this,(ulong)(uVar1 & 0xff));
  return;
}

Assistant:

inline void ReadDeletedProperty(const field_id_t field_id, const char *tag) {
		// Try to read the property. If not present, great!
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return;
		}
		// Otherwise read and discard the value
		(void)Read<T>();
		OnOptionalPropertyEnd(true);
	}